

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_regexp.cc
# Opt level: O1

RegExp * re2c::UTF8Range(Range *r)

{
  RegExp *pRVar1;
  RangeSuffix *root;
  RangeSuffix *local_18;
  
  local_18 = (RangeSuffix *)0x0;
  if (r != (Range *)0x0) {
    do {
      UTF8splitByRuneLength(&local_18,r->lb,r->ub - 1);
      r = r->nx;
    } while (r != (Range *)0x0);
  }
  pRVar1 = to_regexp(local_18);
  return pRVar1;
}

Assistant:

RegExp * UTF8Range(const Range * r)
{
	RangeSuffix * root = NULL;
	for (; r != NULL; r = r->next ())
		UTF8splitByRuneLength(root, r->lower (), r->upper () - 1);
	return to_regexp (root);
}